

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O3

void finish_run(testing t)

{
  testing_base_s *ptVar1;
  int __c;
  nsync_dll_list_ pnVar2;
  
  ptVar1 = t->base;
  fflush((FILE *)t->fp);
  nsync_mu_lock(&ptVar1->testing_mu);
  if ((FILE *)t->fp != (FILE *)ptVar1->fp) {
    rewind((FILE *)t->fp);
    while( true ) {
      __c = getc((FILE *)t->fp);
      if (__c == -1) break;
      putc(__c,(FILE *)ptVar1->fp);
    }
    fclose((FILE *)t->fp);
    fflush((FILE *)ptVar1->fp);
  }
  if (ptVar1->exit_status < t->test_status) {
    ptVar1->exit_status = t->test_status;
  }
  pnVar2 = nsync_dll_remove_(ptVar1->children,&t->siblings);
  ptVar1->children = pnVar2;
  ptVar1->child_count = ptVar1->child_count + -1;
  nsync_mu_unlock(&ptVar1->testing_mu);
  free(t);
  return;
}

Assistant:

static void finish_run (testing t) {
	testing_base tb = t->base;
	fflush (t->fp);
	nsync_mu_lock (&tb->testing_mu);
	if (t->fp != tb->fp) {
		int c;
		rewind (t->fp);
		while ((c = getc (t->fp)) != EOF) {
			putc (c, tb->fp);
		}
		fclose (t->fp);
		fflush (tb->fp);
	}
	if (tb->exit_status < t->test_status) {
		tb->exit_status = t->test_status;
	}
	tb->children = nsync_dll_remove_ (tb->children, &t->siblings);
	tb->child_count--;
	nsync_mu_unlock (&tb->testing_mu);
	free (t);
}